

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Unsubtyping::noteNonFlowSubtype(Unsubtyping *this,Expression *sub,Type super)

{
  bool bVar1;
  bool local_31;
  HeapType local_28;
  Expression *local_20;
  Expression *sub_local;
  Unsubtyping *this_local;
  Type super_local;
  
  local_20 = sub;
  sub_local = (Expression *)this;
  this_local = (Unsubtyping *)super.id;
  bVar1 = wasm::Type::isRef((Type *)&this_local);
  local_31 = false;
  if (bVar1) {
    local_28 = wasm::Type::getHeapType((Type *)&this_local);
    local_31 = HeapType::isBasic(&local_28);
  }
  if (local_31 == false) {
    noteSubtype(this,local_20,(Type)this_local);
  }
  return;
}

Assistant:

void noteNonFlowSubtype(Expression* sub, Type super) {
    // This expression's type must be a subtype of |super|, but the value does
    // not flow anywhere - this is a static constraint. As the value does not
    // flow, it cannot reach anywhere else, which means we need this in order to
    // validate but it does not interact with casts. Given that, if super is a
    // basic type then we can simply ignore this: we only remove subtyping
    // between user types, so subtyping wrt basic types is unchanged, and so
    // this constraint will never be a problem.
    //
    // This is sort of a hack because in general to be precise we should not
    // just consider basic types here - in general, we should note for each
    // constraint whether it is a flow-based one or not, and only take the
    // flow-based ones into account when looking at the impact of casts.
    // However, in practice this is enough as the only non-trivial case of
    // |noteNonFlowSubtype| is for RefEq, which uses a basic type (eqref). Other
    // cases of non-flow subtyping end up trivial, e.g., the target of a
    // CallRef is compared to itself (and we ignore constraints of A :> A).
    // However, if we change how |noteNonFlowSubtype| is used in
    // SubtypingDiscoverer then we may need to generalize this.
    if (super.isRef() && super.getHeapType().isBasic()) {
      return;
    }

    // Otherwise, we must take this into account.
    noteSubtype(sub, super);
  }